

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O0

void __thiscall FactorisedJoin::sortDataToProcess(FactorisedJoin *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ValueOrdering __comp;
  double **ppdVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  reference puVar7;
  undefined4 extraout_var_00;
  ulong uVar8;
  ulong *puVar9;
  reference pvVar10;
  double **ppdVar11;
  reference pvVar12;
  DTreeNode *pDVar13;
  string *psVar14;
  size_type prSize;
  long in_RDI;
  ulong uVar15;
  pair<unsigned_long,_unsigned_long> pVar16;
  size_t j_1;
  int_fast16_t pos;
  DTreeNode *node;
  size_t table_1;
  vector<long,_std::allocator<long>_> priority;
  size_t k;
  size_t j;
  size_t i;
  int index;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  pair;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  uint_fast16_t id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t table;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAttributeIDs;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_stack_fffffffffffffdf8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  string *in_stack_fffffffffffffe10;
  DTree *in_stack_fffffffffffffe18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffe20;
  unsigned_long in_stack_fffffffffffffe28;
  unsigned_long in_stack_fffffffffffffe30;
  __normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_>
  in_stack_fffffffffffffe38;
  double **in_stack_fffffffffffffe40;
  double **local_1b0;
  ValueOrdering local_158;
  double **local_148;
  double **local_140;
  string *local_138;
  string *local_130;
  DTreeNode *local_128;
  ulong local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_118;
  pair<int,_int> local_f0;
  double **local_e8;
  ulong local_e0;
  ulong local_d8;
  int local_cc;
  string local_c8 [36];
  int local_a4;
  string local_a0 [32];
  unsigned_long local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_70;
  undefined8 local_68;
  unsigned_long local_60;
  unsigned_long *local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  long local_48;
  ulong local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_20;
  
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1b7366);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
           (allocator_type *)in_stack_fffffffffffffe10);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1b7392);
  local_40 = 0;
  local_1b0 = in_stack_fffffffffffffe40;
  do {
    if (dfdb::params::NUM_OF_TABLES <= local_40) {
      uVar2 = CONCAT44(dfdb::params::NUM_OF_ATTRIBUTES._4_4_,
                       (undefined4)dfdb::params::NUM_OF_ATTRIBUTES);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
      uVar15 = uVar8 + 8;
      if (0xfffffffffffffff7 < uVar8) {
        uVar15 = 0xffffffffffffffff;
      }
      if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      puVar9 = (ulong *)operator_new__(uVar15);
      *puVar9 = uVar2;
      ppdVar11 = (double **)(puVar9 + 1);
      if (uVar2 != 0) {
        ppdVar3 = ppdVar11;
        do {
          local_1b0 = ppdVar3;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1b7722)
          ;
          ppdVar3 = local_1b0 + 3;
        } while (local_1b0 + 3 != ppdVar11 + uVar2 * 3);
      }
      pVar16.second = in_stack_fffffffffffffe28;
      pVar16.first = in_stack_fffffffffffffe30;
      *(double ***)(in_RDI + 0x30) = ppdVar11;
      local_d8 = 0;
      do {
        if (CONCAT44(dfdb::params::NUM_OF_ATTRIBUTES._4_4_,
                     (undefined4)dfdb::params::NUM_OF_ATTRIBUTES) <= local_d8) {
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)0x1b78f8);
          local_120 = 0;
          do {
            iVar5 = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
            if (dfdb::params::NUM_OF_TABLES <= local_120) {
              std::vector<long,_std::allocator<long>_>::~vector
                        ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe10);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)in_stack_fffffffffffffe10);
              return;
            }
            std::vector<long,_std::allocator<long>_>::clear
                      ((vector<long,_std::allocator<long>_> *)0x1b7929);
            std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b793a);
            pDVar13 = DTree::getNode((DTree *)CONCAT44(in_stack_fffffffffffffe0c,
                                                       in_stack_fffffffffffffe08),iVar5);
            for (local_128 = pDVar13->_parent; local_128 != (DTreeNode *)0x0;
                local_128 = local_128->_parent) {
              local_130 = (string *)0xffffffffffffffff;
              local_138 = (string *)0x0;
              while( true ) {
                in_stack_fffffffffffffe10 = local_138;
                pvVar10 = std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_20,local_120);
                psVar14 = (string *)std::vector<int,_std::allocator<int>_>::size(pvVar10);
                if (psVar14 <= in_stack_fffffffffffffe10) break;
                in_stack_fffffffffffffe0c = local_128->_id;
                pvVar10 = std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[](&local_20,local_120);
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (pvVar10,(size_type)local_138);
                if (in_stack_fffffffffffffe0c == *pvVar12) {
                  local_130 = local_138;
                  break;
                }
                local_138 = (string *)&local_138->field_0x1;
              }
              if (local_130 != (string *)0xffffffffffffffff) {
                std::vector<long,_std::allocator<long>_>::push_back
                          ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe10,
                           (value_type_conflict4 *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
              }
            }
            local_140 = (double **)
                        std::vector<double_*,_std::allocator<double_*>_>::begin
                                  ((vector<double_*,_std::allocator<double_*>_> *)
                                   in_stack_fffffffffffffdf8);
            local_148 = (double **)
                        std::vector<double_*,_std::allocator<double_*>_>::end
                                  ((vector<double_*,_std::allocator<double_*>_> *)
                                   in_stack_fffffffffffffdf8);
            in_stack_fffffffffffffdf8 = &local_118;
            in_stack_fffffffffffffe00 =
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)std::vector<long,_std::allocator<long>_>::data
                              ((vector<long,_std::allocator<long>_> *)0x1b7b03);
            prSize = std::vector<long,_std::allocator<long>_>::size
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdf8);
            ValueOrdering::ValueOrdering
                      (&local_158,(int_fast16_t *)in_stack_fffffffffffffe00,prSize);
            __comp.priorityMaxIndex = pVar16.first;
            __comp.priority = (int_fast16_t *)pVar16.second;
            std::
            sort<__gnu_cxx::__normal_iterator<double**,std::vector<double*,std::allocator<double*>>>,FactorisedJoin::ValueOrdering>
                      ((__normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_>
                        )local_1b0,in_stack_fffffffffffffe38,__comp);
            local_120 = local_120 + 1;
          } while( true );
        }
        for (local_e0 = 0; local_e0 < dfdb::params::NUM_OF_TABLES; local_e0 = local_e0 + 1) {
          local_e8 = (double **)0x0;
          while( true ) {
            in_stack_fffffffffffffe38._M_current = local_e8;
            pvVar10 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_20,local_e0);
            ppdVar11 = (double **)std::vector<int,_std::allocator<int>_>::size(pvVar10);
            if (ppdVar11 <= in_stack_fffffffffffffe38._M_current) break;
            pvVar10 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[](&local_20,local_e0);
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                (pvVar10,(size_type)local_e8);
            if (*pvVar12 == (int)local_d8) {
              pVar16 = std::make_pair<unsigned_long&,unsigned_long&>
                                 ((unsigned_long *)in_stack_fffffffffffffe00,
                                  (unsigned_long *)in_stack_fffffffffffffdf8);
              local_118._24_16_ = pVar16;
              std::pair<int,_int>::pair<unsigned_long,_unsigned_long,_true>
                        (&local_f0,
                         (pair<unsigned_long,_unsigned_long> *)((long)&local_118.first.field_2 + 8))
              ;
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
              break;
            }
            local_e8 = (double **)((long)local_e8 + 1);
          }
        }
        local_d8 = local_d8 + 1;
      } while( true );
    }
    peVar6 = std::__shared_ptr_access<DataHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<DataHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b73c7);
    iVar5 = (*peVar6->_vptr_DataHandler[5])();
    local_48 = CONCAT44(extraout_var,iVar5) + local_40 * 0x18;
    local_50._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffdf8);
    local_58 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffdf8), bVar4) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_50);
      local_60 = *puVar7;
      peVar6 = std::__shared_ptr_access<DataHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<DataHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b746a);
      iVar5 = (*peVar6->_vptr_DataHandler[9])();
      local_68 = CONCAT44(extraout_var_00,iVar5);
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffdf8);
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffdf8);
      while (bVar4 = std::__detail::operator!=(&local_70,&local_78), bVar4) {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
        ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                     *)0x1b74e5);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        if (local_80 == local_60) {
          std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1b751e);
          std::__cxx11::string::string(local_c8,local_a0);
          iVar5 = DTree::getIndexByName(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          std::__cxx11::string::~string(local_c8);
          local_a4 = iVar5;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[](&local_20,local_40);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          local_cc = 7;
        }
        else {
          local_cc = 0;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)0x1b7637);
        if (local_cc != 0) break;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                      *)in_stack_fffffffffffffe00);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_50);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void FactorisedJoin::sortDataToProcess()
{
    /* Contains an ID for each node in the DTree and for each table. */
    vector<vector<int> > treeAttributeIDs(NUM_OF_TABLES);

    /* Iterate through all tables. */
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        /* Iterate through all the table attribute IDs of the current table. */
        for (uint_fast16_t id : _dataHandler->getTableAttributes()[table])
        {
            /* Scan through the (string, ID) mapping to find the attribute name of the current attribute ID. */
            for (auto pair : _dataHandler->getNamesMapping())
            {
                if (pair.second == id)
                {
                    /* Retrieve DTree ID with attribute name. */
                    auto index = _dTree->getIndexByName(pair.first);

                    treeAttributeIDs[table].push_back(
                        index);
                    break;
                }
            }
        }
    }

    /*
     * The ids vectors will contain the pairs of INDEXES in the array attributes-attr.
     * For each attribute KEY-index we append the pairs of indexes having that key,
     * so we will have all the pairs of <relationIndex-attributeIndex> for each attribute KEY.
     */
    _ids = new vector<pair<int, int> > [NUM_OF_ATTRIBUTES];
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        for (size_t j = 0; j < NUM_OF_TABLES; ++j)
        {
            for (size_t k = 0; k < treeAttributeIDs[j].size(); ++k)
                if (treeAttributeIDs[j][k] == (int) i)
                {
                    _ids[i].push_back(make_pair(j, k));
                    break;
                }
        }
    }

    vector<int_fast16_t> priority;
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        priority.clear();

        DTreeNode* node = _dTree->getNode(table + NUM_OF_ATTRIBUTES)->_parent;

        while (node != NULL)
        {
            int_fast16_t pos = -1;
            for (size_t j = 0; j < treeAttributeIDs[table].size(); ++j)
                if (node->_id == treeAttributeIDs[table][j])
                {
                    pos = j;
                    break;
                }
            if (pos != -1)
                priority.push_back(pos);
            node = node->_parent;
        }

        /* Launch sorting; depending on the compiler, this will or will not be done in parallel. */
        sortingAlgorithm(_data[table].begin(), _data[table].end(),
                         ValueOrdering(priority.data(), priority.size()));
    }

    DINFO("WORKER - engine: finished sorting data to process.\n");
}